

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O0

Node * __thiscall
Lib::
SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::SListIntermediateNode::NodePtrComparator>
::pop(SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::SListIntermediateNode::NodePtrComparator>
      *this)

{
  undefined8 *puVar1;
  long *in_RDI;
  Node *val;
  uint i;
  uint h;
  Node *node;
  Node *node_00;
  uint local_18;
  uint local_14;
  
  puVar1 = *(undefined8 **)(*in_RDI + 8);
  local_14 = 1;
  while ((local_14 < *(uint *)(in_RDI + 1) &&
         (*(undefined8 **)(*in_RDI + 8 + (ulong)local_14 * 8) == puVar1))) {
    local_14 = local_14 + 1;
  }
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    *(undefined8 *)(*in_RDI + 8 + (ulong)local_18 * 8) = puVar1[(ulong)local_18 + 1];
  }
  node_00 = (Node *)*puVar1;
  deallocate((Node *)node_00,(uint)((ulong)in_RDI >> 0x20));
  return node_00;
}

Assistant:

Value pop()
  {
    ASS(isNonEmpty());

    // find the height of the first
    Node* node = _left->nodes[0];
    unsigned h;
    for (h = 1;h < _top;h++) {
      if (_left->nodes[h] != node) {
	break;
      }
    }
    // the height of the first node is h-1
    for (unsigned i = 0;i < h;i++) {
      _left->nodes[i] = node->nodes[i];
    }
    Value val = node->value;
    deallocate(node,h-1);
    return val;
  }